

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrn_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::LRN_x86_avx::forward_inplace(LRN_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  void *pvVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  int *piVar9;
  pointer piVar10;
  Mat *pMVar11;
  _func_int **pp_Var12;
  ulong uVar13;
  Mat *pMVar14;
  int k;
  uint uVar15;
  _func_int *p_Var16;
  ulong uVar17;
  long lVar18;
  int j;
  _func_int ***ppp_Var19;
  ulong uVar20;
  long lVar21;
  int iVar22;
  int iVar23;
  long lVar24;
  float *pfVar25;
  _func_int ***ppp_Var26;
  int iVar27;
  uint uVar28;
  int iVar29;
  void *pvVar30;
  int q;
  uint uVar31;
  int iVar32;
  float fVar33;
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  float fVar36;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  allocator_type local_199;
  Mat *local_198;
  LRN_x86_avx *local_190;
  Mat local_188;
  Mat *local_140;
  _func_int ***local_138;
  Mat *local_130;
  undefined1 local_128 [16];
  Mat local_118;
  Allocator *local_d0;
  void *local_c8;
  long local_c0;
  long local_b8;
  Mat *local_b0;
  long local_a8;
  long local_a0;
  undefined1 local_98 [8];
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  vector<int,_std::allocator<int>_> _space_ofs;
  
  uVar15 = bottom_top_blob->w;
  local_198 = (Mat *)(ulong)(uint)bottom_top_blob->h;
  uVar28 = bottom_top_blob->c;
  sVar2 = bottom_top_blob->elemsize;
  local_118.cstep = 0;
  local_118.data = (Allocator *)0x0;
  local_118.refcount._0_4_ = 0;
  local_118.refcount._4_4_ = 0;
  local_118.elemsize = SUB168(ZEXT816(0) << 0x40,4);
  local_118.elempack = 0;
  local_118.allocator = (Allocator *)local_118.data;
  local_118.dims = (int)local_118.refcount;
  local_118.w = local_118.refcount._4_4_;
  local_118._48_8_ = local_118.elemsize;
  local_118.c = local_118.elempack;
  Mat::create(&local_118,uVar15,bottom_top_blob->h,uVar28,sVar2,opt->workspace_allocator);
  iVar27 = -100;
  if (((Allocator *)local_118.data == (Allocator *)0x0) ||
     ((long)local_118.c * local_118.cstep == 0)) goto LAB_00307b1e;
  local_98 = (undefined1  [8])sVar2;
  local_128._0_8_ = opt;
  local_a0 = (long)(int)uVar15;
  iVar27 = (int)local_198 * uVar15;
  pMVar11 = (Mat *)0x0;
  local_140 = (Mat *)0x0;
  if (0 < (int)uVar28) {
    local_140 = (Mat *)(ulong)uVar28;
  }
  for (; pMVar11 != local_140; pMVar11 = (Mat *)((long)&pMVar11->data + 1)) {
    pvVar30 = bottom_top_blob->data;
    sVar3 = bottom_top_blob->elemsize;
    sVar4 = bottom_top_blob->cstep;
    pfVar25 = (float *)(sVar4 * (long)pMVar11 * sVar3 + (long)pvVar30);
    ppp_Var19 = (_func_int ***)
                ((long)(_func_int ***)local_118.data +
                local_118.cstep * (long)pMVar11 * local_118.elemsize);
    lVar21 = 0;
    for (iVar29 = 0; iVar29 + 7 < iVar27; iVar29 = iVar29 + 8) {
      auVar6._4_4_ = pfVar25[1] * pfVar25[1];
      auVar6._0_4_ = *pfVar25 * *pfVar25;
      auVar6._8_4_ = pfVar25[2] * pfVar25[2];
      auVar6._12_4_ = pfVar25[3] * pfVar25[3];
      auVar6._16_4_ = pfVar25[4] * pfVar25[4];
      auVar6._20_4_ = pfVar25[5] * pfVar25[5];
      auVar6._24_4_ = pfVar25[6] * pfVar25[6];
      auVar6._28_4_ = pfVar25[7];
      *(undefined1 (*) [32])ppp_Var19 = auVar6;
      pfVar25 = pfVar25 + 8;
      ppp_Var19 = ppp_Var19 + 4;
      lVar21 = lVar21 + 8;
    }
    for (; (int)lVar21 < iVar27; lVar21 = lVar21 + 1) {
      fVar33 = *(float *)((long)pvVar30 + lVar21 * 4 + sVar4 * sVar3 * (long)pMVar11);
      *(float *)((long)(_func_int ***)local_118.data +
                lVar21 * 4 + local_118.cstep * local_118.elemsize * (long)pMVar11) = fVar33 * fVar33
      ;
    }
  }
  pp_Var12 = this->_vptr_LRN_x86_avx;
  local_190 = this;
  if (*(int *)(&this->field_0xd0 + (long)pp_Var12[-3]) == 0) {
    local_188.cstep = 0;
    local_188.data = (Allocator *)0x0;
    local_188.refcount._0_4_ = 0;
    local_188.refcount._4_4_ = 0;
    local_188.elemsize._0_4_ = 0;
    local_188.elemsize._4_4_ = 0;
    local_188.elempack = 0;
    local_188.allocator = (Allocator *)0x0;
    local_188.dims = 0;
    local_188.w = 0;
    local_188.h = 0;
    local_188.d = 0;
    local_188.c = 0;
    Mat::create(&local_188,uVar15,(int)local_198,uVar28,sVar2,opt->workspace_allocator);
    if (((Allocator *)local_188.data == (Allocator *)0x0) ||
       (local_188.cstep * (long)local_188.c == 0)) {
      piVar9 = (int *)CONCAT44(local_188.refcount._4_4_,(int)local_188.refcount);
      iVar27 = -100;
      if (piVar9 == (int *)0x0) goto LAB_00307b1e;
      LOCK();
      *piVar9 = *piVar9 + -1;
      UNLOCK();
      if (*piVar9 != 0) goto LAB_00307b1e;
      if (local_188.allocator != (Allocator *)0x0) {
        (*(local_188.allocator)->_vptr_Allocator[3])();
        goto LAB_00307b1e;
      }
LAB_00307b72:
      iVar27 = -100;
      free(local_188.data);
      goto LAB_00307b1e;
    }
    uVar15 = (int)local_188.cstep * local_188.c;
    uVar20 = 0;
    uVar13 = (ulong)uVar15;
    if ((int)uVar15 < 1) {
      uVar13 = uVar20;
    }
    for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
      *(undefined4 *)((long)(_func_int ***)local_188.data + uVar20 * 4) = 0;
    }
    pp_Var12 = this->_vptr_LRN_x86_avx;
    local_128._0_4_ =
         *(float *)(&this->field_0xd8 + (long)pp_Var12[-3]) /
         (float)*(int *)(&this->field_0xd4 + (long)pp_Var12[-3]);
    local_128._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar52 = vshufps_avx(local_128,local_128,0);
    register0x00001210 = auVar52;
    _local_98 = auVar52;
    local_138 = (_func_int ***)CONCAT44(local_138._4_4_,uVar28);
    local_130 = bottom_top_blob;
    for (pMVar11 = (Mat *)0x0; pvVar30 = local_188.data, pMVar11 != local_140;
        pMVar11 = (Mat *)((long)&pMVar11->data + 1)) {
      p_Var16 = pp_Var12[-3];
      iVar29 = *(int *)(&this->field_0xd4 + (long)p_Var16);
      for (uVar15 = iVar29 / -2 + (int)pMVar11; (int)uVar15 <= iVar29 / 2 + (int)pMVar11;
          uVar15 = uVar15 + 1) {
        if ((int)uVar15 < (int)uVar28 && -1 < (int)uVar15) {
          ppp_Var26 = (_func_int ***)
                      ((long)(_func_int ***)local_118.data +
                      local_118.cstep * uVar15 * local_118.elemsize);
          lVar24 = local_188.cstep * (long)pMVar11 *
                   CONCAT44(local_188.elemsize._4_4_,(undefined4)local_188.elemsize);
          ppp_Var19 = (_func_int ***)((long)(_func_int ***)local_188.data + lVar24);
          lVar21 = 0;
          for (iVar29 = 0; iVar29 + 7 < iVar27; iVar29 = iVar29 + 8) {
            auVar34._0_4_ = *(float *)ppp_Var19 + *(float *)ppp_Var26;
            auVar34._4_4_ = *(float *)((long)ppp_Var19 + 4) + *(float *)((long)ppp_Var26 + 4);
            auVar34._8_4_ = *(float *)(ppp_Var19 + 1) + *(float *)(ppp_Var26 + 1);
            auVar34._12_4_ =
                 *(float *)((long)(ppp_Var19 + 1) + 4) + *(float *)((long)(ppp_Var26 + 1) + 4);
            auVar34._16_4_ = *(float *)(ppp_Var19 + 2) + *(float *)(ppp_Var26 + 2);
            auVar34._20_4_ =
                 *(float *)((long)(ppp_Var19 + 2) + 4) + *(float *)((long)(ppp_Var26 + 2) + 4);
            auVar34._24_4_ = *(float *)(ppp_Var19 + 3) + *(float *)(ppp_Var26 + 3);
            auVar34._28_4_ =
                 *(float *)((long)(ppp_Var19 + 3) + 4) + *(float *)((long)(ppp_Var26 + 3) + 4);
            *(undefined1 (*) [32])ppp_Var19 = auVar34;
            ppp_Var26 = ppp_Var26 + 4;
            ppp_Var19 = ppp_Var19 + 4;
            lVar21 = lVar21 + 8;
          }
          for (; (int)lVar21 < iVar27; lVar21 = lVar21 + 1) {
            *(float *)((long)(_func_int ***)local_188.data + lVar21 * 4 + lVar24) =
                 *(float *)((long)(_func_int ***)local_188.data + lVar21 * 4 + lVar24) +
                 *(float *)((long)(_func_int ***)local_118.data +
                           lVar21 * 4 + local_118.cstep * local_118.elemsize * (ulong)uVar15);
          }
          p_Var16 = pp_Var12[-3];
          iVar29 = *(int *)(&local_190->field_0xd4 + (long)p_Var16);
          this = local_190;
        }
      }
      pvVar5 = local_130->data;
      sVar2 = local_130->elemsize;
      sVar3 = local_130->cstep;
      pfVar25 = (float *)(sVar3 * (long)pMVar11 * sVar2 + (long)pvVar5);
      ppp_Var19 = (_func_int ***)
                  ((long)(_func_int ***)local_188.data +
                  local_188.cstep * (long)pMVar11 *
                  CONCAT44(local_188.elemsize._4_4_,(undefined4)local_188.elemsize));
      fVar33 = *(float *)(&this->field_0xe0 + (long)p_Var16);
      fVar1 = *(float *)(&this->field_0xdc + (long)p_Var16);
      uVar13 = CONCAT44(fVar1,fVar1) ^ 0x8000000080000000;
      lVar21 = 0;
      for (iVar29 = 0; iVar29 + 7 < iVar27; iVar29 = iVar29 + 8) {
        auVar35._0_4_ = (float)local_98._0_4_ * *(float *)ppp_Var19 + fVar33;
        auVar35._4_4_ = (float)local_98._4_4_ * *(float *)((long)ppp_Var19 + 4) + fVar33;
        auVar35._8_4_ = fStack_90 * *(float *)(ppp_Var19 + 1) + fVar33;
        auVar35._12_4_ = fStack_8c * *(float *)((long)(ppp_Var19 + 1) + 4) + fVar33;
        auVar35._16_4_ = fStack_88 * *(float *)(ppp_Var19 + 2) + fVar33;
        auVar35._20_4_ = fStack_84 * *(float *)((long)(ppp_Var19 + 2) + 4) + fVar33;
        auVar35._24_4_ = fStack_80 * *(float *)(ppp_Var19 + 3) + fVar33;
        auVar35._28_4_ = fStack_7c + fVar33;
        auVar37._8_4_ = 0x800000;
        auVar37._0_8_ = 0x80000000800000;
        auVar37._12_4_ = 0x800000;
        auVar37._16_4_ = 0x800000;
        auVar37._20_4_ = 0x800000;
        auVar37._24_4_ = 0x800000;
        auVar37._28_4_ = 0x800000;
        auVar7 = vmaxps_avx(auVar35,auVar37);
        auVar52 = vpsrld_avx(auVar7._16_16_,0x17);
        auVar38._8_4_ = 0x807fffff;
        auVar38._0_8_ = 0x807fffff807fffff;
        auVar38._12_4_ = 0x807fffff;
        auVar38._16_4_ = 0x807fffff;
        auVar38._20_4_ = 0x807fffff;
        auVar38._24_4_ = 0x807fffff;
        auVar38._28_4_ = 0x807fffff;
        auVar6 = vandps_avx(auVar7,auVar38);
        auVar57._8_4_ = 0x3f000000;
        auVar57._0_8_ = 0x3f0000003f000000;
        auVar57._12_4_ = 0x3f000000;
        auVar57._16_4_ = 0x3f000000;
        auVar57._20_4_ = 0x3f000000;
        auVar57._24_4_ = 0x3f000000;
        auVar57._28_4_ = 0x3f000000;
        auVar8 = vorps_avx(auVar57,auVar6);
        auVar54._8_4_ = 0x3f3504f3;
        auVar54._0_8_ = 0x3f3504f33f3504f3;
        auVar54._12_4_ = 0x3f3504f3;
        auVar54._16_4_ = 0x3f3504f3;
        auVar54._20_4_ = 0x3f3504f3;
        auVar54._24_4_ = 0x3f3504f3;
        auVar54._28_4_ = 0x3f3504f3;
        auVar34 = vcmpps_avx(auVar54,auVar8,2);
        auVar6 = vandnps_avx(auVar34,auVar8);
        fVar36 = auVar8._0_4_ + -1.0 + auVar6._0_4_;
        fVar44 = auVar8._4_4_ + -1.0 + auVar6._4_4_;
        fVar45 = auVar8._8_4_ + -1.0 + auVar6._8_4_;
        fVar46 = auVar8._12_4_ + -1.0 + auVar6._12_4_;
        fVar47 = auVar8._16_4_ + -1.0 + auVar6._16_4_;
        fVar48 = auVar8._20_4_ + -1.0 + auVar6._20_4_;
        fVar49 = auVar8._24_4_ + -1.0 + auVar6._24_4_;
        auVar52 = vpsubd_avx(auVar52,auVar34._16_16_);
        auVar50 = vpsrld_avx(auVar7._0_16_,0x17);
        auVar55._8_4_ = 0xffffff81;
        auVar55._0_8_ = 0xffffff81ffffff81;
        auVar55._12_4_ = 0xffffff81;
        auVar52 = vpaddd_avx(auVar52,auVar55);
        auVar50 = vpsubd_avx(auVar50,auVar34._0_16_);
        auVar50 = vpaddd_avx(auVar50,auVar55);
        auVar51._16_16_ = auVar52;
        auVar51._0_16_ = auVar50;
        auVar34 = vcmpps_avx(auVar35,_DAT_004c7360,2);
        auVar7 = vcvtdq2ps_avx(auVar51);
        auVar39._0_4_ =
             auVar7._0_4_ * 0.6931472 + fVar36 +
             fVar36 * fVar36 *
             (((((((((fVar36 * 0.070376836 + -0.1151461) * fVar36 + 0.116769984) * fVar36 +
                   -0.12420141) * fVar36 + 0.14249323) * fVar36 + -0.16668057) * fVar36 + 0.20000714
                ) * fVar36 + -0.24999994) * fVar36 + 0.3333333) * fVar36 + -0.5);
        auVar39._4_4_ =
             auVar7._4_4_ * 0.6931472 + fVar44 +
             fVar44 * fVar44 *
             (((((((((fVar44 * 0.070376836 + -0.1151461) * fVar44 + 0.116769984) * fVar44 +
                   -0.12420141) * fVar44 + 0.14249323) * fVar44 + -0.16668057) * fVar44 + 0.20000714
                ) * fVar44 + -0.24999994) * fVar44 + 0.3333333) * fVar44 + -0.5);
        auVar39._8_4_ =
             auVar7._8_4_ * 0.6931472 + fVar45 +
             fVar45 * fVar45 *
             (((((((((fVar45 * 0.070376836 + -0.1151461) * fVar45 + 0.116769984) * fVar45 +
                   -0.12420141) * fVar45 + 0.14249323) * fVar45 + -0.16668057) * fVar45 + 0.20000714
                ) * fVar45 + -0.24999994) * fVar45 + 0.3333333) * fVar45 + -0.5);
        auVar39._12_4_ =
             auVar7._12_4_ * 0.6931472 + fVar46 +
             fVar46 * fVar46 *
             (((((((((fVar46 * 0.070376836 + -0.1151461) * fVar46 + 0.116769984) * fVar46 +
                   -0.12420141) * fVar46 + 0.14249323) * fVar46 + -0.16668057) * fVar46 + 0.20000714
                ) * fVar46 + -0.24999994) * fVar46 + 0.3333333) * fVar46 + -0.5);
        auVar39._16_4_ =
             auVar7._16_4_ * 0.6931472 + fVar47 +
             fVar47 * fVar47 *
             (((((((((fVar47 * 0.070376836 + -0.1151461) * fVar47 + 0.116769984) * fVar47 +
                   -0.12420141) * fVar47 + 0.14249323) * fVar47 + -0.16668057) * fVar47 + 0.20000714
                ) * fVar47 + -0.24999994) * fVar47 + 0.3333333) * fVar47 + -0.5);
        auVar39._20_4_ =
             auVar7._20_4_ * 0.6931472 + fVar48 +
             fVar48 * fVar48 *
             (((((((((fVar48 * 0.070376836 + -0.1151461) * fVar48 + 0.116769984) * fVar48 +
                   -0.12420141) * fVar48 + 0.14249323) * fVar48 + -0.16668057) * fVar48 + 0.20000714
                ) * fVar48 + -0.24999994) * fVar48 + 0.3333333) * fVar48 + -0.5);
        auVar39._24_4_ =
             auVar7._24_4_ * 0.6931472 + fVar49 +
             fVar49 * fVar49 *
             (((((((((fVar49 * 0.070376836 + -0.1151461) * fVar49 + 0.116769984) * fVar49 +
                   -0.12420141) * fVar49 + 0.14249323) * fVar49 + -0.16668057) * fVar49 + 0.20000714
                ) * fVar49 + -0.24999994) * fVar49 + 0.3333333) * fVar49 + -0.5);
        auVar39._28_4_ = auVar7._28_4_ + auVar8._28_4_ + -1.0 + auVar6._28_4_ + 0.0;
        auVar6 = vorps_avx(auVar34,auVar39);
        fVar36 = (float)uVar13;
        fVar44 = (float)(uVar13 >> 0x20);
        auVar7._4_4_ = auVar6._4_4_ * fVar44;
        auVar7._0_4_ = auVar6._0_4_ * fVar36;
        auVar7._8_4_ = auVar6._8_4_ * -fVar1;
        auVar7._12_4_ = auVar6._12_4_ * -fVar1;
        auVar7._16_4_ = auVar6._16_4_ * fVar36;
        auVar7._20_4_ = auVar6._20_4_ * fVar44;
        auVar7._24_4_ = auVar6._24_4_ * -fVar1;
        auVar7._28_4_ = auVar6._28_4_;
        auVar40._8_4_ = 0x42b0c0a5;
        auVar40._0_8_ = 0x42b0c0a542b0c0a5;
        auVar40._12_4_ = 0x42b0c0a5;
        auVar40._16_4_ = 0x42b0c0a5;
        auVar40._20_4_ = 0x42b0c0a5;
        auVar40._24_4_ = 0x42b0c0a5;
        auVar40._28_4_ = 0x42b0c0a5;
        auVar6 = vminps_avx(auVar7,auVar40);
        auVar41._8_4_ = 0xc2b0c0a5;
        auVar41._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar41._12_4_ = 0xc2b0c0a5;
        auVar41._16_4_ = 0xc2b0c0a5;
        auVar41._20_4_ = 0xc2b0c0a5;
        auVar41._24_4_ = 0xc2b0c0a5;
        auVar41._28_4_ = 0xc2b0c0a5;
        auVar34 = vmaxps_avx(auVar6,auVar41);
        auVar42._0_4_ = auVar34._0_4_ * 1.442695 + 0.5;
        auVar42._4_4_ = auVar34._4_4_ * 1.442695 + 0.5;
        auVar42._8_4_ = auVar34._8_4_ * 1.442695 + 0.5;
        auVar42._12_4_ = auVar34._12_4_ * 1.442695 + 0.5;
        auVar42._16_4_ = auVar34._16_4_ * 1.442695 + 0.5;
        auVar42._20_4_ = auVar34._20_4_ * 1.442695 + 0.5;
        auVar42._24_4_ = auVar34._24_4_ * 1.442695 + 0.5;
        auVar42._28_4_ = 0x3ff8aa3b;
        auVar7 = vroundps_avx(auVar42,1);
        auVar6 = vcmpps_avx(auVar42,auVar7,1);
        auVar56._8_4_ = 0x3f800000;
        auVar56._0_8_ = 0x3f8000003f800000;
        auVar56._12_4_ = 0x3f800000;
        auVar56._16_4_ = 0x3f800000;
        auVar56._20_4_ = 0x3f800000;
        auVar56._24_4_ = 0x3f800000;
        auVar56._28_4_ = 0x3f800000;
        auVar6 = vandps_avx(auVar6,auVar56);
        auVar6 = vsubps_avx(auVar7,auVar6);
        auVar8._4_4_ = auVar6._4_4_ * 0.6931472;
        auVar8._0_4_ = auVar6._0_4_ * 0.6931472;
        auVar8._8_4_ = auVar6._8_4_ * 0.6931472;
        auVar8._12_4_ = auVar6._12_4_ * 0.6931472;
        auVar8._16_4_ = auVar6._16_4_ * 0.6931472;
        auVar8._20_4_ = auVar6._20_4_ * 0.6931472;
        auVar8._24_4_ = auVar6._24_4_ * 0.6931472;
        auVar8._28_4_ = auVar7._28_4_;
        auVar34 = vsubps_avx(auVar34,auVar8);
        fVar36 = auVar34._0_4_;
        fVar44 = auVar34._4_4_;
        fVar45 = auVar34._8_4_;
        fVar46 = auVar34._12_4_;
        fVar47 = auVar34._16_4_;
        fVar48 = auVar34._20_4_;
        fVar49 = auVar34._24_4_;
        auVar52._0_4_ = (int)auVar6._0_4_;
        auVar52._4_4_ = (int)auVar6._4_4_;
        auVar52._8_4_ = (int)auVar6._8_4_;
        auVar52._12_4_ = (int)auVar6._12_4_;
        auVar43._16_4_ = (int)auVar6._16_4_;
        auVar43._0_16_ = auVar52;
        auVar43._20_4_ = (int)auVar6._20_4_;
        auVar43._24_4_ = (int)auVar6._24_4_;
        auVar43._28_4_ = (int)auVar6._28_4_;
        auVar50 = vpslld_avx(auVar52,0x17);
        auVar52 = vpslld_avx(auVar43._16_16_,0x17);
        auVar53._8_4_ = 0x3f800000;
        auVar53._0_8_ = 0x3f8000003f800000;
        auVar53._12_4_ = 0x3f800000;
        auVar52 = vpaddd_avx(auVar52,auVar53);
        auVar50 = vpaddd_avx(auVar50,auVar53);
        *pfVar25 = auVar50._0_4_ * *pfVar25 *
                   (fVar36 + 1.0 +
                   fVar36 * fVar36 *
                   (((((fVar36 * 0.00019875691 + 0.0013981999) * fVar36 + 0.008333452) * fVar36 +
                     0.041665796) * fVar36 + 0.16666666) * fVar36 + 0.5));
        pfVar25[1] = auVar50._4_4_ * pfVar25[1] *
                     (fVar44 + 1.0 +
                     fVar44 * fVar44 *
                     (((((fVar44 * 0.00019875691 + 0.0013981999) * fVar44 + 0.008333452) * fVar44 +
                       0.041665796) * fVar44 + 0.16666666) * fVar44 + 0.5));
        pfVar25[2] = auVar50._8_4_ * pfVar25[2] *
                     (fVar45 + 1.0 +
                     fVar45 * fVar45 *
                     (((((fVar45 * 0.00019875691 + 0.0013981999) * fVar45 + 0.008333452) * fVar45 +
                       0.041665796) * fVar45 + 0.16666666) * fVar45 + 0.5));
        pfVar25[3] = auVar50._12_4_ * pfVar25[3] *
                     (fVar46 + 1.0 +
                     fVar46 * fVar46 *
                     (((((fVar46 * 0.00019875691 + 0.0013981999) * fVar46 + 0.008333452) * fVar46 +
                       0.041665796) * fVar46 + 0.16666666) * fVar46 + 0.5));
        pfVar25[4] = auVar52._0_4_ * pfVar25[4] *
                     (fVar47 + 1.0 +
                     fVar47 * fVar47 *
                     (((((fVar47 * 0.00019875691 + 0.0013981999) * fVar47 + 0.008333452) * fVar47 +
                       0.041665796) * fVar47 + 0.16666666) * fVar47 + 0.5));
        pfVar25[5] = auVar52._4_4_ * pfVar25[5] *
                     (fVar48 + 1.0 +
                     fVar48 * fVar48 *
                     (((((fVar48 * 0.00019875691 + 0.0013981999) * fVar48 + 0.008333452) * fVar48 +
                       0.041665796) * fVar48 + 0.16666666) * fVar48 + 0.5));
        pfVar25[6] = auVar52._8_4_ * pfVar25[6] *
                     (fVar49 + 1.0 +
                     fVar49 * fVar49 *
                     (((((fVar49 * 0.00019875691 + 0.0013981999) * fVar49 + 0.008333452) * fVar49 +
                       0.041665796) * fVar49 + 0.16666666) * fVar49 + 0.5));
        pfVar25[7] = auVar34._28_4_ + 1.0 + auVar7._28_4_;
        ppp_Var19 = ppp_Var19 + 4;
        pfVar25 = pfVar25 + 8;
        lVar21 = lVar21 + 8;
      }
      lVar24 = sVar3 * sVar2 * (long)pMVar11;
      lVar18 = local_188.cstep * CONCAT44(local_188.elemsize._4_4_,(undefined4)local_188.elemsize);
      for (; (int)lVar21 < iVar27; lVar21 = lVar21 + 1) {
        fVar33 = powf((float)local_128._0_4_ *
                      *(float *)((long)(_func_int ***)pvVar30 + lVar21 * 4 + lVar18 * (long)pMVar11)
                      + *(float *)(&this->field_0xe0 + (long)pp_Var12[-3]),
                      -*(float *)(&this->field_0xdc + (long)pp_Var12[-3]));
        *(float *)((long)pvVar5 + lVar21 * 4 + lVar24) =
             fVar33 * *(float *)((long)pvVar5 + lVar21 * 4 + lVar24);
      }
      uVar28 = (uint)local_138;
    }
    piVar9 = (int *)CONCAT44(local_188.refcount._4_4_,(int)local_188.refcount);
    if (piVar9 != (int *)0x0) {
      LOCK();
      *piVar9 = *piVar9 + -1;
      UNLOCK();
      if (*piVar9 == 0) {
        if (local_188.allocator == (Allocator *)0x0) goto LAB_00307b11;
        (*(local_188.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  else {
    iVar27 = 0;
    if (*(int *)(&this->field_0xd0 + (long)pp_Var12[-3]) != 1) goto LAB_00307b1e;
    piVar9 = (int *)CONCAT44(local_118.refcount._4_4_,(int)local_118.refcount);
    local_188.data = local_118.data;
    local_188.refcount._0_4_ = (int)local_118.refcount;
    local_188.refcount._4_4_ = local_118.refcount._4_4_;
    local_188.elemsize._0_4_ = (undefined4)local_118.elemsize;
    local_188.elemsize._4_4_ = (undefined4)(local_118.elemsize >> 0x20);
    local_188.elempack = local_118.elempack;
    local_188.allocator = local_118.allocator;
    local_188.dims = local_118.dims;
    local_188.w = local_118.w;
    local_188.h = local_118.h;
    local_188.d = local_118.d;
    local_188.c = local_118.c;
    local_188.cstep = local_118.cstep;
    if (piVar9 != (int *)0x0) {
      LOCK();
      *piVar9 = *piVar9 + 1;
      UNLOCK();
      pp_Var12 = this->_vptr_LRN_x86_avx;
    }
    p_Var16 = pp_Var12[-3];
    uVar28 = *(uint *)(&this->field_0xd4 + (long)p_Var16);
    uVar31 = uVar15;
    if (1 < (int)uVar28) {
      uVar28 = uVar28 >> 1;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = *(pointer *)opt;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)opt->workspace_allocator;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)opt->workspace_allocator;
      iVar27 = ~uVar28 + *(int *)(&this->field_0xd4 + (long)pp_Var12[-3]);
      copy_make_border(&local_118,&local_188,uVar28,iVar27,uVar28,iVar27,0,0.0,(Option *)&_space_ofs
                      );
      iVar27 = -100;
      if (((Allocator *)local_188.data == (Allocator *)0x0) ||
         ((long)local_188.c * local_188.cstep == 0)) {
        piVar9 = (int *)CONCAT44(local_188.refcount._4_4_,(int)local_188.refcount);
        if (piVar9 == (int *)0x0) goto LAB_00307b1e;
        LOCK();
        *piVar9 = *piVar9 + -1;
        UNLOCK();
        if (*piVar9 != 0) goto LAB_00307b1e;
        if (local_188.allocator != (Allocator *)0x0) {
          (*(local_188.allocator)->_vptr_Allocator[3])();
          goto LAB_00307b1e;
        }
        goto LAB_00307b72;
      }
      p_Var16 = this->_vptr_LRN_x86_avx[-3];
      uVar28 = *(uint *)(&this->field_0xd4 + (long)p_Var16);
      uVar31 = local_188.w;
    }
    uVar28 = uVar28 * uVar28;
    local_128._0_4_ = *(undefined4 *)(&this->field_0xd8 + (long)p_Var16);
    std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,(ulong)uVar28,&local_199);
    piVar10 = _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    pp_Var12 = this->_vptr_LRN_x86_avx;
    iVar27 = *(int *)(&this->field_0xd4 + (long)pp_Var12[-3]);
    iVar32 = uVar31 - iVar27;
    lVar21 = 0;
    iVar29 = 0;
    for (iVar22 = 0; iVar22 < iVar27; iVar22 = iVar22 + 1) {
      for (lVar24 = 0; iVar23 = (int)lVar24, iVar23 < iVar27; lVar24 = lVar24 + 1) {
        _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[(int)lVar21 + lVar24] = iVar29 + iVar23;
        iVar27 = *(int *)(&this->field_0xd4 + (long)pp_Var12[-3]);
      }
      iVar29 = iVar29 + iVar32 + iVar23;
      lVar21 = (int)lVar21 + lVar24;
    }
    local_b8 = bottom_top_blob->cstep * bottom_top_blob->elemsize;
    local_c0 = local_188.cstep * CONCAT44(local_188.elemsize._4_4_,(undefined4)local_188.elemsize);
    local_a8 = (long)local_188.w * CONCAT44(local_188.elemsize._4_4_,(undefined4)local_188.elemsize)
    ;
    uVar13 = (ulong)uVar15;
    if ((int)uVar15 < 1) {
      uVar13 = 0;
    }
    local_c8 = bottom_top_blob->data;
    pMVar11 = (Mat *)0x0;
    iVar27 = (int)local_198;
    local_198 = (Mat *)((ulong)local_198 & 0xffffffff);
    if (iVar27 < 1) {
      local_198 = pMVar11;
    }
    local_d0 = (Allocator *)local_188.data;
    local_98._0_4_ = 1.0 / (float)(int)uVar28;
    while (pMVar11 != local_140) {
      pvVar30 = (void *)(local_b8 * (long)pMVar11 + (long)local_c8);
      local_138 = (_func_int ***)((long)&local_d0->_vptr_Allocator + local_c0 * (long)pMVar11);
      pMVar14 = (Mat *)0x0;
      local_b0 = pMVar11;
      while (ppp_Var19 = local_138, pMVar14 != local_198) {
        lVar21 = local_a8 * (long)pMVar14;
        pp_Var12 = this->_vptr_LRN_x86_avx;
        local_130 = pMVar14;
        for (uVar20 = 0; uVar20 != uVar13; uVar20 = uVar20 + 1) {
          fVar33 = 0.0;
          for (uVar17 = 0; uVar28 != uVar17; uVar17 = uVar17 + 1) {
            fVar33 = fVar33 + *(float *)((long)ppp_Var19 +
                                        (long)piVar10[uVar17] * 4 + uVar20 * 4 + lVar21);
          }
          fVar33 = powf(fVar33 * (float)local_128._0_4_ * (float)local_98._0_4_ +
                        *(float *)(&local_190->field_0xe0 + (long)pp_Var12[-3]),
                        -*(float *)(&local_190->field_0xdc + (long)pp_Var12[-3]));
          *(float *)((long)pvVar30 + uVar20 * 4) = fVar33 * *(float *)((long)pvVar30 + uVar20 * 4);
        }
        pvVar30 = (void *)((long)pvVar30 + local_a0 * 4);
        this = local_190;
        pMVar14 = (Mat *)((long)&local_130->data + 1);
      }
      pMVar11 = (Mat *)((long)&local_b0->data + 1);
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&_space_ofs.super__Vector_base<int,_std::allocator<int>_>);
    piVar9 = (int *)CONCAT44(local_188.refcount._4_4_,(int)local_188.refcount);
    if (piVar9 != (int *)0x0) {
      LOCK();
      *piVar9 = *piVar9 + -1;
      UNLOCK();
      if (*piVar9 == 0) {
        if (local_188.allocator == (Allocator *)0x0) {
LAB_00307b11:
          free(local_188.data);
        }
        else {
          (*(local_188.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  iVar27 = 0;
LAB_00307b1e:
  piVar9 = (int *)CONCAT44(local_118.refcount._4_4_,(int)local_118.refcount);
  if (piVar9 != (int *)0x0) {
    LOCK();
    *piVar9 = *piVar9 + -1;
    UNLOCK();
    if (*piVar9 == 0) {
      if (local_118.allocator == (Allocator *)0x0) {
        free(local_118.data);
      }
      else {
        (*(local_118.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar27;
}

Assistant:

int LRN_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    size_t elemsize = bottom_top_blob.elemsize;
    int size = w * h;

    // squared values with local_size padding
    Mat square_blob;
    square_blob.create(w, h, channels, elemsize, opt.workspace_allocator);
    if (square_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = bottom_top_blob.channel(q);
        float* outptr = square_blob.channel(q);

        int i = 0;
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _outp = _mm256_mul_ps(_p, _p);
            _mm256_storeu_ps(outptr, _outp);

            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i < size; i++)
        {
            *outptr = *ptr * *ptr;

            ptr++;
            outptr++;
        }
    }

    if (region_type == NormRegion_ACROSS_CHANNELS)
    {
        Mat square_sum;
        square_sum.create(w, h, channels, elemsize, opt.workspace_allocator);
        if (square_sum.empty())
            return -100;
        square_sum.fill(0.f);

        const float alpha_div_size = alpha / local_size;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            // square sum
            for (int p = q - local_size / 2; p <= q + local_size / 2; p++)
            {
                if (p < 0 || p >= channels)
                    continue;

                const float* sptr = square_blob.channel(p);
                float* ssptr = square_sum.channel(q);

                int i = 0;
#if __AVX__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _sp = _mm256_loadu_ps(sptr);
                    __m256 _ssp = _mm256_loadu_ps(ssptr);
                    _ssp = _mm256_add_ps(_ssp, _sp);
                    _mm256_storeu_ps(ssptr, _ssp);

                    sptr += 8;
                    ssptr += 8;
                }
#endif // __AVX__
                for (; i < size; i++)
                {
                    *ssptr += *sptr;
                    sptr++;
                    ssptr++;
                }
            }

            float* ptr = bottom_top_blob.channel(q);
            float* ssptr = square_sum.channel(q);

            int i = 0;
#if __AVX__
            __m256 _bias = _mm256_set1_ps(bias);
            __m256 _ads = _mm256_set1_ps(alpha_div_size);
            __m256 _mb = _mm256_set1_ps(-beta);
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _ssp = _mm256_loadu_ps(ssptr);
                _ssp = _mm256_mul_ps(_ssp, _ads);
                _ssp = _mm256_add_ps(_ssp, _bias);
                _ssp = pow256_ps(_ssp, _mb);
                _p = _mm256_mul_ps(_p, _ssp);
                _mm256_storeu_ps(ptr, _p);

                ssptr += 8;
                ptr += 8;
            }
#endif // __AVX__
            for (; i < size; i++)
            {
                *ptr = *ptr * pow(bias + alpha_div_size * *ssptr, -beta);

                ssptr++;
                ptr++;
            }
        }
    }
    else if (region_type == NormRegion_WITHIN_CHANNEL)
    {
        int outw = w;
        int outh = h;

        Mat square_blob_bordered = square_blob;
        int pad = local_size / 2;
        if (pad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(square_blob, square_blob_bordered, pad, local_size - pad - 1, pad, local_size - pad - 1, BORDER_CONSTANT, 0.f, opt_b);
            if (square_blob_bordered.empty())
                return -100;

            w = square_blob_bordered.w;
            h = square_blob_bordered.h;
        }

        const int maxk = local_size * local_size;

        const float alpha_div_size = alpha / maxk;

        // norm window offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - local_size;
            for (int i = 0; i < local_size; i++)
            {
                for (int j = 0; j < local_size; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            const Mat m = square_blob_bordered.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i) + j;

                    float ss = 0.f;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[space_ofs[k]];
                        ss += val;
                    }

                    ptr[j] = ptr[j] * pow(bias + alpha_div_size * ss, -beta);
                }

                ptr += outw;
            }
        }
    }

    return 0;
}